

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall FlowGraph::Dump(FlowGraph *this)

{
  Loop *pLVar1;
  SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Type *ppBVar6;
  Loop **ppLVar7;
  BasicBlock *this_00;
  Iterator local_40;
  
  Output::Print(L"\nFlowGraph\n");
  this_00 = (BasicBlock *)&this->blockList;
  while (this_00 = this_00->next, this_00 != (BasicBlock *)0x0) {
    if ((this_00->field_0x18 & 1) == 0) {
      ppLVar7 = &this_00->loop;
      while (pLVar1 = *ppLVar7, pLVar1 != (Loop *)0x0) {
        Output::Print(L"    ");
        ppLVar7 = &pLVar1->parent;
      }
      BasicBlock::DumpHeader(this_00,false);
    }
  }
  Output::Print(L"\nLoopGraph\n");
  ppLVar7 = &this->loopList;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    pLVar1 = *ppLVar7;
    if (pLVar1 == (Loop *)0x0) {
      return;
    }
    Output::Print(L"\nLoop\n");
    local_40.list =
         &(pLVar1->blockList).super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>;
    local_40.current = &(local_40.list)->super_SListNodeBase<Memory::ArenaAllocator>;
    while( true ) {
      if ((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
          (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
      }
      pSVar2 = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
               (((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                &(local_40.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if (pSVar2 == local_40.list) break;
      local_40.current = (NodeBase *)pSVar2;
      ppBVar6 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          (&local_40);
      if (((*ppBVar6)->field_0x18 & 1) == 0) {
        BasicBlock::DumpHeader(*ppBVar6,false);
      }
    }
    Output::Print(L"Loop  Ends\n");
    ppLVar7 = &pLVar1->next;
  } while( true );
}

Assistant:

void
FlowGraph::Dump()
{
    Output::Print(_u("\nFlowGraph\n"));
    FOREACH_BLOCK(block, this)
    {
        Loop * loop = block->loop;
        while (loop)
        {
            Output::Print(_u("    "));
            loop = loop->parent;
        }
        block->DumpHeader(false);
    } NEXT_BLOCK;

    Output::Print(_u("\nLoopGraph\n"));

    for (Loop *loop = this->loopList; loop; loop = loop->next)
    {
        Output::Print(_u("\nLoop\n"));
        FOREACH_BLOCK_IN_LOOP(block, loop)
        {
            block->DumpHeader(false);
        }NEXT_BLOCK_IN_LOOP;
        Output::Print(_u("Loop  Ends\n"));
    }
}